

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-dis.c
# Opt level: O1

void envydis(disisa *isa,FILE *out,uint8_t *code,uint32_t start,int num,varinfo *varinfo,int quiet,
            label *labels,int labelsnum,envy_colors *cols)

{
  label *plVar1;
  ull *puVar2;
  byte bVar3;
  int iVar4;
  bool bVar5;
  bool bVar6;
  uint8_t *puVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint uVar10;
  uint uVar11;
  uint32_t uVar12;
  int *__ptr;
  char **__ptr_00;
  envy_colors *peVar13;
  dis_res *pdVar14;
  uint32_t uVar15;
  int iVar16;
  char *pcVar17;
  long lVar18;
  int iVar19;
  int iVar20;
  char *pcVar21;
  char *__format;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  uint uVar25;
  byte *pbVar26;
  bool bVar27;
  int iVar28;
  uint32_t uVar29;
  decoctx c;
  decoctx local_88;
  ulong local_40;
  uint8_t *local_38;
  
  local_88.marks = (int *)0x0;
  local_88.names = (char **)0x0;
  local_88.labels = (label *)0x0;
  local_88.labelsnum = 0;
  local_88.labelsmax = 0;
  local_88.isa = (disisa *)0x0;
  local_88.varinfo = (varinfo *)0x0;
  local_88.codebase = 0;
  local_88.code = code;
  local_88.codesz = num;
  __ptr = (int *)calloc((long)num,4);
  local_88.marks = __ptr;
  __ptr_00 = (char **)calloc((long)num,8);
  local_88.codebase = start;
  local_88.labels = labels;
  local_88.labelsnum = labelsnum;
  local_88.isa = isa;
  local_88.varinfo = varinfo;
  local_88.names = __ptr_00;
  uVar8 = ed_getcbsz(isa,varinfo);
  uVar9 = ed_getcbsz(isa,varinfo);
  if (labels == (label *)0x0) {
    if (0 < num) {
      uVar29 = 0;
      do {
        pdVar14 = do_dis(&local_88,uVar29);
        dis_dopp(&local_88,pdVar14,(ulong)(uVar29 + start));
        uVar29 = uVar29 + pdVar14->oplen + (uint)(pdVar14->oplen == 0);
        easm_del_insn(pdVar14->insn);
        free(pdVar14);
      } while ((int)uVar29 < num);
    }
  }
  else {
    if (0 < labelsnum) {
      uVar10 = start + num;
      uVar22 = 0;
      do {
        plVar1 = labels + uVar22;
        uVar23 = plVar1->val;
        uVar11 = (uint)uVar23;
        if (uVar11 < uVar10 && start <= uVar11) {
          __ptr[uVar11 - start] = __ptr[uVar11 - start] | plVar1->type;
        }
        if ((uVar23 < uVar10 && start <= uVar23) && (plVar1->name != (char *)0x0)) {
          __ptr_00[uVar23 - start] = plVar1->name;
        }
        if ((plVar1->size != 0) && (uVar11 = plVar1->size, (ulong)uVar11 != 0)) {
          uVar24 = 0;
          do {
            uVar25 = (uint)uVar23;
            if (uVar25 < uVar10 && start <= uVar25) {
              __ptr[uVar25 - start] = __ptr[uVar25 - start] | plVar1->type;
            }
            uVar24 = uVar24 + 4;
            uVar23 = (ulong)(uVar25 + 4);
          } while (uVar24 < uVar11);
        }
        uVar22 = uVar22 + 1;
      } while (uVar22 != (uint)labelsnum);
    }
    if (0 < num) {
      bVar6 = true;
      uVar29 = 0;
      uVar10 = 0;
      do {
        do {
          if (uVar10 == 0) {
            uVar10 = __ptr[(int)uVar29];
            bVar27 = true;
            if ((char)((uVar10 & 8) >> 3) == '\0' && (uVar10 & 3) != 0) {
              __ptr[(int)uVar29] = uVar10 | 8;
              bVar27 = false;
              bVar6 = false;
            }
          }
          else {
            bVar27 = false;
          }
          if (bVar27) {
            uVar29 = uVar29 + 1;
            uVar10 = 0;
          }
          else {
            pdVar14 = do_dis(&local_88,uVar29);
            dis_dopp(&local_88,pdVar14,(ulong)(uVar29 + start));
            uVar12 = pdVar14->oplen;
            uVar10 = 0;
            if ((uVar12 != 0) && (pdVar14->endmark == 0)) {
              uVar10 = (__ptr[(int)uVar29] & 4U) >> 2 ^ 1;
              if ((__ptr[(int)uVar29] & 4U) != 0) {
                uVar12 = 0;
              }
              uVar29 = uVar12 + uVar29;
            }
            easm_del_insn(pdVar14->insn);
            free(pdVar14);
          }
        } while ((int)uVar29 < num);
        if (bVar6) break;
        uVar29 = 0;
        bVar6 = true;
        uVar10 = 0;
      } while (0 < num);
    }
  }
  if (num < 1) {
LAB_0026a630:
    free(__ptr);
    free(__ptr_00);
    return;
  }
  uVar10 = uVar8 + 7 >> 3;
  local_40 = (ulong)uVar10;
  local_38 = code + -1;
  uVar29 = 0;
  bVar6 = false;
  uVar22 = 0;
  bVar27 = false;
LAB_00269d4c:
  uVar11 = __ptr[(int)uVar29];
  uVar25 = (uint)uVar22;
  if (__ptr_00[(int)uVar29] != (char *)0x0) {
    if (uVar25 != 0) {
      peVar13 = (envy_colors *)&cols->err;
      if (!bVar6) {
        peVar13 = cols;
      }
      pcVar21 = "%s[%x bytes skipped]\n";
      if (!bVar6) {
        pcVar21 = "%s[%x zero bytes skipped]\n";
      }
      bVar6 = false;
      fprintf((FILE *)out,pcVar21,peVar13->reset,uVar22);
    }
    if ((uVar11 & 0x1b0) == 0) {
      if ((uVar11 & 2) == 0) {
        if ((uVar11 & 1) == 0) {
          pcVar21 = cols->reset;
        }
        else {
          pcVar21 = cols->btarg;
        }
        uVar25 = 0;
        fprintf((FILE *)out,"%s%s:\n",pcVar21,__ptr_00[(int)uVar29]);
        goto LAB_00269e27;
      }
      pcVar21 = cols->ctarg;
      pcVar17 = __ptr_00[(int)uVar29];
      __format = "\n%s%s:\n";
    }
    else {
      pcVar21 = cols->reset;
      pcVar17 = __ptr_00[(int)uVar29];
      __format = "%s%s:\n";
    }
    uVar25 = 0;
    fprintf((FILE *)out,__format,pcVar21,pcVar17);
  }
LAB_00269e27:
  if ((!bVar27) && ((uVar11 & 0x1b0) != 0)) {
    if (uVar25 != 0) {
      peVar13 = (envy_colors *)&cols->err;
      if (!bVar6) {
        peVar13 = cols;
      }
      pcVar21 = "%s[%x bytes skipped]\n";
      if (!bVar6) {
        pcVar21 = "%s[%x zero bytes skipped]\n";
      }
      bVar6 = false;
      fprintf((FILE *)out,pcVar21,peVar13->reset,(ulong)uVar25);
    }
    if (uVar9 != 8) {
      abort();
    }
    fprintf((FILE *)out,"%s%08x:%s",cols->mem);
    if ((char)uVar11 < '\0') {
      fprintf((FILE *)out," %s%02x\n",cols->num,(ulong)code[(int)uVar29]);
      uVar29 = uVar29 + 1;
    }
    else if ((uVar11 >> 8 & 1) == 0) {
      if ((uVar11 & 0x10) == 0) {
        fprintf((FILE *)out," %s\"",cols->num);
        pbVar26 = code + (int)uVar29;
        do {
          uVar29 = uVar29 + 1;
          bVar3 = *pbVar26;
          uVar11 = (uint)bVar3;
          if (bVar3 < 0x22) {
            if (bVar3 == 10) {
              pcVar21 = "\\n";
              goto LAB_0026a065;
            }
            if (uVar11 == 0) goto LAB_0026a325;
LAB_0026a077:
            fputc(uVar11,(FILE *)out);
          }
          else {
            if (uVar11 == 0x22) {
              pcVar21 = "\\\"";
            }
            else {
              if (uVar11 != 0x5c) goto LAB_0026a077;
              pcVar21 = "\\\\";
            }
LAB_0026a065:
            fwrite(pcVar21,2,1,(FILE *)out);
          }
          pbVar26 = pbVar26 + 1;
        } while( true );
      }
      uVar12 = num;
      if (num < (int)uVar29) {
        uVar12 = uVar29;
      }
      pbVar26 = code + (int)uVar29;
      lVar18 = 0;
      uVar11 = 0;
      do {
        if ((ulong)(uVar12 - uVar29) << 3 == lVar18) break;
        uVar11 = uVar11 | (uint)*pbVar26 << ((byte)lVar18 & 0x1f);
        pbVar26 = pbVar26 + 1;
        lVar18 = lVar18 + 8;
      } while (lVar18 != 0x20);
      fprintf((FILE *)out," %s%08x\n",cols->num,(ulong)uVar11);
      uVar29 = uVar29 + 4;
    }
    else {
      uVar12 = num;
      if (num < (int)uVar29) {
        uVar12 = uVar29;
      }
      pbVar26 = code + (int)uVar29;
      lVar18 = 0;
      uVar11 = 0;
      do {
        if ((ulong)(uVar12 - uVar29) << 3 == lVar18) break;
        uVar11 = uVar11 | (uint)*pbVar26 << ((byte)lVar18 & 0x1f);
        pbVar26 = pbVar26 + 1;
        lVar18 = lVar18 + 8;
      } while (lVar18 == 8);
      fprintf((FILE *)out," %s%04x\n",cols->num,(ulong)(uVar11 & 0xffff));
      uVar29 = uVar29 + 2;
    }
    goto LAB_0026a341;
  }
  if (((labels == (label *)0x0) || (bVar27)) || ((uVar11 & 7) != 0)) {
    if (uVar25 != 0) {
      peVar13 = (envy_colors *)&cols->err;
      if (!bVar6) {
        peVar13 = cols;
      }
      pcVar21 = "%s[%x bytes skipped]\n";
      if (!bVar6) {
        pcVar21 = "%s[%x zero bytes skipped]\n";
      }
      bVar6 = false;
      fprintf((FILE *)out,pcVar21,peVar13->reset,(ulong)uVar25);
    }
    pdVar14 = do_dis(&local_88,uVar29);
    dis_dopp(&local_88,pdVar14,(ulong)(uVar29 + start));
    iVar4 = pdVar14->endmark;
    if (((uVar11 & 2) != 0) && (__ptr_00[(int)uVar29] == (char *)0x0)) {
      fputc(10,(FILE *)out);
    }
    switch(uVar11 & 3) {
    case 0:
      if (quiet == 0) {
        fprintf((FILE *)out,"%s%08x:%s");
        goto LAB_0026a18b;
      }
      goto LAB_0026a193;
    case 1:
      pcVar21 = cols->btarg;
      break;
    case 2:
      pcVar21 = cols->ctarg;
      break;
    case 3:
      pcVar21 = cols->bctarg;
    }
    fprintf((FILE *)out,"%s%08x:%s",pcVar21);
LAB_0026a18b:
    if (quiet == 0) {
      if (0 < isa->maxoplen) {
        iVar19 = 0;
        do {
          fputc(0x20,(FILE *)out);
          puVar7 = local_38;
          uVar25 = isa->opunit * uVar10;
          if (0 < (int)uVar25) {
            uVar22 = (ulong)uVar25;
            do {
              iVar20 = (int)((uVar22 - 1 & 0xffffffff) / (ulong)uVar10);
              uVar25 = iVar20 + iVar19;
              if ((uVar25 == 0) || (uVar25 < pdVar14->oplen)) {
                if ((int)(iVar20 + iVar19 + uVar29) < num) {
                  fprintf((FILE *)out,"%s%02x",cols->reset,
                          (ulong)puVar7[uVar22 + (long)(int)((iVar19 + uVar29) * uVar10)]);
                }
                else {
                  fprintf((FILE *)out,"%s??",cols->err);
                }
              }
              else {
                fwrite("  ",2,1,(FILE *)out);
              }
              bVar5 = 1 < (long)uVar22;
              uVar22 = uVar22 - 1;
            } while (bVar5);
          }
          iVar19 = iVar19 + isa->opunit;
        } while (iVar19 < isa->maxoplen);
      }
      fwrite("  ",2,1,(FILE *)out);
      if ((uVar11 & 2) == 0) {
        fputc(0x20,(FILE *)out);
      }
      else {
        fprintf((FILE *)out,"%sC",cols->ctarg);
      }
      if ((uVar11 & 1) == 0) {
        iVar19 = 0x20;
        fputc(0x20,(FILE *)out);
      }
      else {
        fprintf((FILE *)out,"%sB",cols->btarg);
        iVar19 = 0x20;
      }
LAB_0026a3d2:
      fputc(iVar19,(FILE *)out);
    }
    else {
LAB_0026a193:
      if ((quiet == 1) && (iVar19 = 10, uVar11 != 0)) goto LAB_0026a3d2;
    }
    easm_print_insn(out,cols,pdVar14->insn);
    if ((pdVar14->status & DIS_STATUS_UNK_FORM) == DIS_STATUS_OK) {
      uVar12 = pdVar14->oplen;
      if ((int)uVar12 < 0x10) {
        iVar19 = uVar12 * 8;
        do {
          uVar15 = uVar12 + 7;
          if (-1 < (int)uVar12) {
            uVar15 = uVar12;
          }
          pdVar14->a[(int)uVar15 >> 3] =
               pdVar14->a[(int)uVar15 >> 3] & ~(0xffL << ((byte)iVar19 & 0x38));
          uVar12 = uVar12 + 1;
          iVar19 = iVar19 + 8;
        } while (uVar12 != 0x10);
      }
      lVar18 = 0;
      bVar5 = false;
      do {
        puVar2 = pdVar14->a + lVar18;
        *puVar2 = *puVar2 & ~pdVar14->m[lVar18];
        if (*puVar2 != 0) {
          bVar5 = true;
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 == 1);
      if (bVar5) {
        uVar25 = 0;
        fprintf((FILE *)out," %s[unknown:",cols->err);
        do {
          fputc(0x20,(FILE *)out);
          iVar19 = isa->opunit * uVar10;
          if (0 < iVar19) {
            iVar20 = (iVar19 + uVar25 + -1) * 8;
            do {
              iVar28 = iVar19 + -1;
              if ((int)(uVar29 + uVar25 + iVar28) < num) {
                iVar16 = uVar25 + 7 + iVar28;
                if (-1 < (int)(uVar25 + iVar28)) {
                  iVar16 = uVar25 + iVar28;
                }
                fprintf((FILE *)out,"%02llx",pdVar14->a[iVar16 >> 3] >> ((byte)iVar20 & 0x38) & 0xff
                       );
              }
              else {
                fwrite("??",2,1,(FILE *)out);
              }
              iVar20 = iVar20 + -8;
              bVar5 = 1 < iVar19;
              iVar19 = iVar28;
            } while (bVar5);
          }
          uVar25 = uVar25 + isa->opunit;
        } while ((uVar25 == 0) || (uVar25 < pdVar14->oplen));
        fputc(0x5d,(FILE *)out);
      }
    }
    else {
      fprintf((FILE *)out," %s[unknown op length]%s",cols->err,cols->reset);
    }
    if ((pdVar14->status & DIS_STATUS_EOF) != DIS_STATUS_OK) {
      fprintf((FILE *)out," %s[incomplete]%s",cols->err,cols->reset);
    }
    if ((pdVar14->status & DIS_STATUS_UNK_INSN) != DIS_STATUS_OK) {
      fprintf((FILE *)out," %s[unknown instruction]%s",cols->err,cols->reset);
    }
    if ((pdVar14->status & DIS_STATUS_UNK_OPERAND) != DIS_STATUS_OK) {
      fprintf((FILE *)out," %s[unknown operand]%s",cols->err,cols->reset);
    }
    bVar27 = ((uVar11 & 4) == 0 && iVar4 == 0) && (bVar27 || (uVar11 & 7) != 0);
    fprintf((FILE *)out,"%s\n",cols->reset);
    uVar29 = uVar29 + pdVar14->oplen;
    easm_del_insn(pdVar14->insn);
    free(pdVar14);
    uVar22 = 0;
  }
  else {
    if (7 < uVar8 + 7) {
      uVar22 = 0;
      do {
        if (code[uVar22 + (long)(int)(uVar29 * uVar10)] != '\0') {
          bVar6 = true;
        }
        uVar22 = uVar22 + 1;
      } while (local_40 != uVar22);
    }
    uVar29 = uVar29 + 1;
    uVar22 = (ulong)(uVar25 + 1);
    bVar27 = false;
  }
  goto LAB_0026a628;
LAB_0026a325:
  fwrite("\"\n",2,1,(FILE *)out);
LAB_0026a341:
  bVar27 = false;
  uVar22 = 0;
LAB_0026a628:
  if (num <= (int)uVar29) goto LAB_0026a630;
  goto LAB_00269d4c;
}

Assistant:

void envydis (const struct disisa *isa, FILE *out, uint8_t *code, uint32_t start, int num, struct varinfo *varinfo, int quiet, struct label *labels, int labelsnum, const struct envy_colors *cols)
{
	struct decoctx c = { 0 };
	struct decoctx *ctx = &c;
	int cur = 0, i, j;
	ctx->code = code;
	ctx->codesz = num;
	ctx->marks = calloc(num, sizeof *ctx->marks);
	ctx->names = calloc(num, sizeof *ctx->names);
	ctx->codebase = start;
	ctx->varinfo = varinfo;
	ctx->isa = isa;
	ctx->labels = labels;
	ctx->labelsnum = labelsnum;
	int stride = ed_getcstride(ctx->isa, ctx->varinfo);
	int cbsz = ed_getcbsz(ctx->isa, ctx->varinfo);
	if (labels) {
		for (i = 0; i < labelsnum; i++) {
			mark(ctx, labels[i].val, labels[i].type);
			if (labels[i].val >= ctx->codebase && labels[i].val < ctx->codebase + ctx->codesz) {
				if (labels[i].name)
					ctx->names[labels[i].val - ctx->codebase] = labels[i].name;
			}
			if (labels[i].size) {
				for (j = 0; j < labels[i].size; j+=4)
					mark(ctx, labels[i].val + j, labels[i].type);
			}
		}
		int done;
		do {
			done = 1;
			cur = 0;
			int active = 0;
			while (cur < num) {
				if (!active && (ctx->marks[cur] & 3) && !(ctx->marks[cur] & 8)) {
					done = 0;
					active = 1;
					ctx->marks[cur] |= 8;
				}
				if (active) {
					struct dis_res *dres = do_dis(ctx, cur);
					dis_dopp(ctx, dres, cur + start);
					if (dres->oplen && !dres->endmark && !(ctx->marks[cur] & 4))
						cur += dres->oplen;
					else
						active = 0;
					dis_del_res(dres);
				} else {
					cur++;
				}
			}
		} while (!done);
	} else {
		while (cur < num) {
			struct dis_res *dres = do_dis(ctx, cur);
			dis_dopp(ctx, dres, cur + start);
			if (dres->oplen)
				cur += dres->oplen;
			else
				cur++;
			dis_del_res(dres);
		}
	}
	cur = 0;
	int active = 0;
	int skip = 0, nonzero = 0;
	while (cur < num) {
		int mark = ctx->marks[cur];
		if (ctx->names[cur]) {
			if (skip) {
				if (nonzero)
					fprintf(out, "%s[%x bytes skipped]\n", cols->err, skip);
				else
					fprintf(out, "%s[%x zero bytes skipped]\n", cols->reset, skip);
				skip = 0;
				nonzero = 0;
			}
			if (mark & 0x1b0)
				fprintf (out, "%s%s:\n", cols->reset, ctx->names[cur]);
			else if (mark & 2)
				fprintf (out, "\n%s%s:\n", cols->ctarg, ctx->names[cur]);
			else if (mark & 1)
				fprintf (out, "%s%s:\n", cols->btarg, ctx->names[cur]);
			else
				fprintf (out, "%s%s:\n", cols->reset, ctx->names[cur]);
		}
		if (mark & 0x1b0 && !active) {
			if (skip) {
				if (nonzero)
					fprintf(out, "%s[%x bytes skipped]\n", cols->err, skip);
				else
					fprintf(out, "%s[%x zero bytes skipped]\n", cols->reset, skip);
				skip = 0;
				nonzero = 0;
			}
			if (cbsz != 8)
				abort();
			fprintf (out, "%s%08x:%s", cols->mem, cur + start, cols->reset);
			if (mark & 0x80) {
				uint8_t val = code[cur];
				fprintf (out, " %s%02x\n", cols->num, val);
				cur += 1;
			} else if (mark & 0x100) {
				uint16_t val = 0;
				for (i = 0; i < 2 && cur + i < num; i++) {
					val |= code[cur + i] << i*8;
				}
				fprintf (out, " %s%04x\n", cols->num, val);
				cur += 2;
			} else if (mark & 0x10) {
				uint32_t val = 0;
				for (i = 0; i < 4 && cur + i < num; i++) {
					val |= code[cur + i] << i*8;
				}
				fprintf (out, " %s%08x\n", cols->num, val);
				cur += 4;
			} else {
				fprintf (out, " %s\"", cols->num);
				while (code[cur]) {
					switch (code[cur]) {
						case '\n':
							fprintf (out, "\\n");
							break;
						case '\\':
							fprintf (out, "\\\\");
							break;
						case '\"':
							fprintf (out, "\\\"");
							break;
						default:
							fprintf (out, "%c", code[cur]);
							break;
					}
					cur++;
				}
				cur++;
				fprintf (out, "\"\n");
			}
			continue;
		}
		if (!active && mark & 7)
			active = 1;
		if (!active && labels) {
			for (i = 0; i < stride; i++)
				if (code[cur*stride+i])
					nonzero = 1;
			cur++;
			skip++;
			continue;
		}
		if (skip) {
			if (nonzero)
				fprintf(out, "%s[%x bytes skipped]\n", cols->err, skip);
			else
				fprintf(out, "%s[%x zero bytes skipped]\n", cols->reset, skip);
			skip = 0;
			nonzero = 0;
		}
		struct dis_res *dres = do_dis(ctx, cur);
		dis_dopp(ctx, dres, cur + start);

		if (dres->endmark || mark & 4)
			active = 0;

		if (mark & 2 && !ctx->names[cur])
			fprintf (out, "\n");
		switch (mark & 3) {
			case 0:
				if (!quiet)
					fprintf (out, "%s%08x:%s", cols->reset, cur + start, cols->reset);
				break;
			case 1:
				fprintf (out, "%s%08x:%s", cols->btarg, cur + start, cols->reset);
				break;
			case 2:
				fprintf (out, "%s%08x:%s", cols->ctarg, cur + start, cols->reset);
				break;
			case 3:
				fprintf (out, "%s%08x:%s", cols->bctarg, cur + start, cols->reset);
				break;
		}

		if (!quiet) {
			for (i = 0; i < isa->maxoplen; i += isa->opunit) {
				fprintf (out, " ");
				for (j = isa->opunit*stride - 1; j >= 0; j--)
					if (i+j/stride && i+j/stride >= dres->oplen) {
						fprintf (out, "  ");
					} else if (cur+i+j/stride >= num) {
						fprintf (out, "%s??", cols->err);
					} else {
						fprintf (out, "%s%02x", cols->reset, code[(cur + i)*stride + j]);
					}
			}
			fprintf (out, "  ");

			if (mark & 2)
				fprintf (out, "%sC", cols->ctarg);
			else
				fprintf (out, " ");
			if (mark & 1)
				fprintf (out, "%sB", cols->btarg);
			else
				fprintf (out, " ");
			fprintf(out, " ");
		} else if (quiet == 1) {
			if (mark)
				fprintf (out, "\n");
		}

		easm_print_insn(out, cols, dres->insn);

		if (dres->status & DIS_STATUS_UNK_FORM) {
			fprintf (out, " %s[unknown op length]%s", cols->err, cols->reset);
		} else {
			int fl = 0;
			for (i = dres->oplen; i < MAXOPLEN * 8; i++)
				dres->a[i/8] &= ~(0xffull << (i & 7) * 8);
			for (i = 0; i < MAXOPLEN; i++) {
				dres->a[i] &= ~dres->m[i];
				if (dres->a[i])
					fl = 1;
			}
			if (fl) {
				fprintf (out, " %s[unknown:", cols->err);
				for (i = 0; i < dres->oplen || i == 0; i += isa->opunit) {
					fprintf (out, " ");
					for (j = isa->opunit*stride - 1; j >= 0; j--)
						if (cur+i+j >= num)
							fprintf (out, "??");
						else
							fprintf (out, "%02llx", (dres->a[(i+j)/8] >> ((i + j)&7) * 8) & 0xff);
				}
				fprintf (out, "]");
			}
		}
		if (dres->status & DIS_STATUS_EOF) {
			fprintf (out, " %s[incomplete]%s", cols->err, cols->reset);
		}
		if (dres->status & DIS_STATUS_UNK_INSN) {
			fprintf (out, " %s[unknown instruction]%s", cols->err, cols->reset);
		}
		if (dres->status & DIS_STATUS_UNK_OPERAND) {
			fprintf (out, " %s[unknown operand]%s", cols->err, cols->reset);
		}
		fprintf (out, "%s\n", cols->reset);
		cur += dres->oplen;

		dis_del_res(dres);
	}
	free(ctx->marks);
	free(ctx->names);
}